

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeleLM.cpp
# Opt level: O2

void __thiscall PeleLM::compute_rhoRT(PeleLM *this,MultiFab *S,MultiFab *Press,int pComp)

{
  double *pdVar1;
  ostream *os_;
  Print *pPVar2;
  long lVar3;
  double *pdVar4;
  double *pdVar5;
  double *pdVar6;
  long lVar7;
  long lVar8;
  int n;
  long lVar9;
  double dVar10;
  double dVar11;
  Box local_324;
  double local_308 [10];
  Array4<const_double> local_2b8;
  Array4<double> local_278;
  Array4<const_double> local_238;
  Array4<const_double> local_1f8;
  MFIter mfi;
  
  dVar10 = amrex::ParallelDescriptor::second();
  amrex::MFIter::MFIter(&mfi,(FabArrayBase *)S,true);
  while (mfi.currentIndex < mfi.endIndex) {
    amrex::MFIter::tilebox(&local_324,&mfi);
    amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
              (&local_1f8,&S->super_FabArray<amrex::FArrayBox>,&mfi,3);
    amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
              (&local_2b8,&S->super_FabArray<amrex::FArrayBox>,&mfi,first_spec);
    amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
              (&local_238,&S->super_FabArray<amrex::FArrayBox>,&mfi,NavierStokesBase::Temp);
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (&local_278,&Press->super_FabArray<amrex::FArrayBox>,&mfi,pComp);
    lVar7 = (long)local_324.smallend.vect[2];
    pdVar5 = (double *)
             ((lVar7 - local_2b8.begin.z) * local_2b8.kstride * 8 +
              ((long)local_324.smallend.vect[1] - (long)local_2b8.begin.y) * local_2b8.jstride * 8 +
              (long)local_324.smallend.vect[0] * 8 + (long)local_2b8.begin.x * -8 +
             (long)local_2b8.p);
    for (; lVar7 <= local_324.bigend.vect[2]; lVar7 = lVar7 + 1) {
      pdVar6 = pdVar5;
      for (lVar3 = (long)local_324.smallend.vect[1]; lVar3 <= local_324.bigend.vect[1];
          lVar3 = lVar3 + 1) {
        if (local_324.smallend.vect[0] <= local_324.bigend.vect[0]) {
          pdVar4 = pdVar6;
          lVar8 = (long)local_324.smallend.vect[0];
          do {
            dVar11 = local_1f8.p
                     [(lVar7 - local_1f8.begin.z) * local_1f8.kstride +
                      (lVar3 - local_1f8.begin.y) * local_1f8.jstride + (lVar8 - local_1f8.begin.x)]
            ;
            local_308[6] = 0.0;
            local_308[7] = 0.0;
            local_308[4] = 0.0;
            local_308[5] = 0.0;
            local_308[8] = 0.0;
            local_308[2] = 0.0;
            local_308[3] = 0.0;
            local_308[0] = 0.0;
            local_308[1] = 0.0;
            pdVar1 = pdVar4;
            for (lVar9 = 0; lVar9 != 9; lVar9 = lVar9 + 1) {
              local_308[lVar9] = *pdVar1 * (1.0 / dVar11);
              pdVar1 = pdVar1 + local_2b8.nstride;
            }
            local_278.p
            [(lVar7 - local_278.begin.z) * local_278.kstride +
             (lVar3 - local_278.begin.y) * local_278.jstride + (lVar8 - local_278.begin.x)] =
                 dVar11 * 0.001 * 83144626.1815324 *
                 local_238.p
                 [(lVar7 - local_238.begin.z) * local_238.kstride +
                  (lVar3 - local_238.begin.y) * local_238.jstride + (lVar8 - local_238.begin.x)] *
                 (local_308[8] * 0.03569643749553795 +
                 local_308[7] * 0.029399658963956014 +
                 local_308[6] * 0.030297521662727988 +
                 local_308[5] * 0.05879931792791203 +
                 local_308[4] * 0.06250390649415588 +
                 local_308[3] * 0.9920634920634921 +
                 local_308[2] * 0.055509297807382736 +
                 local_308[1] * 0.03125195324707794 + local_308[0] * 0.49603174603174605 + 0.0) *
                 0.1;
            lVar8 = lVar8 + 1;
            pdVar4 = pdVar4 + 1;
          } while (local_324.bigend.vect[0] + 1 != (int)lVar8);
        }
        pdVar6 = pdVar6 + local_2b8.jstride;
      }
      pdVar5 = pdVar5 + local_2b8.kstride;
    }
    amrex::MFIter::operator++(&mfi);
  }
  amrex::MFIter::~MFIter(&mfi);
  if (2 < NavierStokesBase::verbose) {
    dVar11 = amrex::ParallelDescriptor::second();
    os_ = amrex::OutStream();
    amrex::Print::Print((Print *)&mfi,os_);
    std::operator<<((ostream *)&mfi.tile_size,"      PeleLM::compute_rhoRT(): lev: ");
    pPVar2 = amrex::Print::operator<<
                       ((Print *)&mfi,&(this->super_NavierStokesBase).super_AmrLevel.level);
    std::operator<<((ostream *)&pPVar2->ss,", time: ");
    std::ostream::_M_insert<double>(dVar11 - dVar10);
    std::operator<<((ostream *)&pPVar2->ss,'\n');
    amrex::Print::~Print((Print *)&mfi);
  }
  return;
}

Assistant:

void
PeleLM::compute_rhoRT (const MultiFab& S,
                             MultiFab& Press,
                             int       pComp)
{
   AMREX_ASSERT(pComp<Press.nComp());

   const Real strt_time = ParallelDescriptor::second();

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
   {
      for (MFIter mfi(S,TilingIfNotGPU()); mfi.isValid(); ++mfi)
      {
         const Box& bx = mfi.tilebox();
         auto const& rho     = S.const_array(mfi,Density);
         auto const& rhoY    = S.const_array(mfi,first_spec);
         auto const& T       = S.const_array(mfi,Temp);
         auto const& P       = Press.array(mfi, pComp);
         amrex::ParallelFor(bx, [rho, rhoY, T, P]
         AMREX_GPU_DEVICE (int i, int j, int k) noexcept
         {
            getPGivenRTY( i, j, k, rho, rhoY, T, P );
         });
      }
   }

   if (verbose > 2)
   {
     const int IOProc   = ParallelDescriptor::IOProcessorNumber();
     Real      run_time = ParallelDescriptor::second() - strt_time;

     ParallelDescriptor::ReduceRealMax(run_time,IOProc);

     amrex::Print() << "      PeleLM::compute_rhoRT(): lev: " << level
                    << ", time: " << run_time << '\n';
   }
}